

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O2

string * ws::wx_sha1(string *__return_storage_ptr__,string *str)

{
  uchar *puVar1;
  MsgCryptoError *this;
  int i;
  long lVar2;
  char tmp [8];
  uchar out [20];
  string local_50;
  
  out[0x10] = '\0';
  out[0x11] = '\0';
  out[0x12] = '\0';
  out[0x13] = '\0';
  out[0] = '\0';
  out[1] = '\0';
  out[2] = '\0';
  out[3] = '\0';
  out[4] = '\0';
  out[5] = '\0';
  out[6] = '\0';
  out[7] = '\0';
  out[8] = '\0';
  out[9] = '\0';
  out[10] = '\0';
  out[0xb] = '\0';
  out[0xc] = '\0';
  out[0xd] = '\0';
  out[0xe] = '\0';
  out[0xf] = '\0';
  puVar1 = SHA1((uchar *)(str->_M_dataplus)._M_p,str->_M_string_length,out);
  if (puVar1 != (uchar *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    tmp[0] = '\0';
    tmp[1] = '\0';
    tmp[2] = '\0';
    tmp[3] = '\0';
    tmp[4] = '\0';
    tmp[5] = '\0';
    tmp[6] = '\0';
    tmp[7] = '\0';
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 1) {
      snprintf(tmp,8,"%02x",(ulong)out[lVar2]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,tmp);
    }
    return __return_storage_ptr__;
  }
  this = (MsgCryptoError *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"sha1 error",(allocator<char> *)tmp);
  MsgCryptoError::MsgCryptoError(this,&local_50,(source_location)0x195130);
  __cxa_throw(this,&MsgCryptoError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string wx_sha1(const std::string &str)
  {
    unsigned char out[SHA_DIGEST_LENGTH] = {0};
    if (SHA1((const unsigned char *) str.c_str(), str.size(), out) == nullptr)
    {
      throw MsgCryptoError("sha1 error");
    }
    
    std::string ret;
    char tmp[8] = {0};
    for (int i = 0; i < SHA_DIGEST_LENGTH; i++)
    {
      snprintf(tmp, sizeof(tmp), "%02x", 0xff & out[i]);
      ret.append(tmp);
    }
    return ret;
  }